

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ColourImpl *streamColour;
  ostream *poVar1;
  TestRunStats *_testRunStats_local;
  CompactReporter *this_local;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  streamColour = Detail::unique_ptr<Catch::ColourImpl>::operator*
                           (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  printTestRunTotals(poVar1,streamColour,&_testRunStats->totals);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"\n\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  Catch::StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
            m_stream << "\n\n" << std::flush;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }